

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.hpp
# Opt level: O0

void __thiscall Mine::~Mine(Mine *this)

{
  Mine *this_local;
  
  ~Mine(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~Mine() {}